

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_relax_snode.h
# Opt level: O1

void __thiscall
Eigen::internal::SparseLUImpl<double,_int>::relax_snode
          (SparseLUImpl<double,_int> *this,int n,IndexVector *et,int relax_columns,
          IndexVector *descendants,IndexVector *relax_end)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  Index othersize;
  long lVar13;
  
  uVar9 = (relax_end->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar9 < 0) {
LAB_0014e6c9:
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<int>, MatrixType = Eigen::Matrix<int, -1, 1>]"
                 );
  }
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (&relax_end->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,uVar9,1);
  uVar7 = (relax_end->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (uVar7 == uVar9) {
    uVar9 = uVar7 + 3;
    if (-1 < (long)uVar7) {
      uVar9 = uVar7;
    }
    if (3 < (long)uVar7) {
      lVar6 = 0;
      do {
        piVar3 = (relax_end->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + lVar6;
        *piVar3 = -1;
        piVar3[1] = -1;
        piVar3[2] = -1;
        piVar3[3] = -1;
        lVar6 = lVar6 + 4;
      } while (lVar6 < (long)(uVar9 & 0xfffffffffffffffc));
    }
    if ((long)(uVar9 & 0xfffffffffffffffc) < (long)uVar7) {
      memset((relax_end->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
             m_data + ((long)uVar9 >> 2) * 4,0xff,uVar7 * 4 + ((long)uVar9 >> 2) * -0x10);
    }
    uVar9 = (descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows;
    if ((long)uVar9 < 0) goto LAB_0014e6c9;
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              (&descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,uVar9,1);
    uVar7 = (descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows;
    if (uVar7 == uVar9) {
      uVar9 = uVar7 + 3;
      if (-1 < (long)uVar7) {
        uVar9 = uVar7;
      }
      if (3 < (long)uVar7) {
        lVar6 = 0;
        do {
          *(undefined1 (*) [16])
           ((descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
            m_data + lVar6) = (undefined1  [16])0x0;
          lVar6 = lVar6 + 4;
        } while (lVar6 < (long)(uVar9 & 0xfffffffffffffffc));
      }
      if ((long)(uVar9 & 0xfffffffffffffffc) < (long)uVar7) {
        memset((descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
               m_data + ((long)uVar9 >> 2) * 4,0,uVar7 * 4 + ((long)uVar9 >> 2) * -0x10);
      }
      if (0 < n) {
        piVar3 = (et->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data;
        uVar9 = (et->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
        piVar4 = (descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        lVar6 = (descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage
                .m_rows;
        uVar7 = 0;
        if ((long)uVar9 < 1) {
          uVar9 = uVar7;
        }
        do {
          if (uVar9 == uVar7) goto LAB_0014e6aa;
          iVar1 = piVar3[uVar7];
          lVar10 = (long)iVar1;
          if (iVar1 != n) {
            if (((lVar6 <= (long)uVar7) || (iVar1 < 0)) || (lVar6 <= lVar10)) goto LAB_0014e6aa;
            piVar4[lVar10] = piVar4[uVar7] + piVar4[lVar10] + 1;
          }
          uVar7 = uVar7 + 1;
        } while ((uint)n != uVar7);
      }
      if (0 < n) {
        piVar3 = (et->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data;
        lVar6 = (et->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
        piVar4 = (relax_end->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        lVar10 = (relax_end->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows;
        piVar5 = (descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        uVar9 = 0;
        do {
          uVar8 = (uint)uVar9;
          if (((int)uVar8 < 0) || (lVar11 = (long)(int)uVar8, lVar6 <= lVar11)) {
LAB_0014e6aa:
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x18a,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
                         );
          }
          uVar2 = piVar3[lVar11];
          if (uVar2 != n) {
            do {
              uVar12 = uVar2;
              uVar8 = (uint)uVar9;
              if ((int)uVar12 < 0) goto LAB_0014e6aa;
              uVar9 = (ulong)uVar12;
              lVar13 = (long)(int)uVar12;
              if ((descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows <= lVar13) goto LAB_0014e6aa;
              if (relax_columns <=
                  (descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data[lVar13]) break;
              if (lVar6 <= lVar13) goto LAB_0014e6aa;
              uVar2 = piVar3[lVar13];
              uVar8 = uVar12;
            } while (uVar2 != n);
          }
          if (lVar10 <= lVar11) goto LAB_0014e6aa;
          piVar4[lVar11] = uVar8;
          uVar7 = (descendants->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows;
          uVar9 = (ulong)(uVar8 + 1);
          if ((long)uVar7 <= (long)uVar9) goto LAB_0014e6aa;
          while (((int)uVar9 < n && (piVar5[uVar9] != 0))) {
            uVar9 = uVar9 + 1;
            if (uVar7 == uVar9) goto LAB_0014e6aa;
          }
        } while ((int)uVar9 < n);
      }
      return;
    }
  }
  __assert_fail("rows() == other.rows() && cols() == other.cols()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Assign.h"
                ,0x1f2,
                "Derived &Eigen::DenseBase<Eigen::Matrix<int, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<int, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>]"
               );
}

Assistant:

void SparseLUImpl<Scalar,Index>::relax_snode (const Index n, IndexVector& et, const Index relax_columns, IndexVector& descendants, IndexVector& relax_end)
{
  
  // compute the number of descendants of each node in the etree
  Index j, parent; 
  relax_end.setConstant(emptyIdxLU);
  descendants.setZero();
  for (j = 0; j < n; j++) 
  {
    parent = et(j);
    if (parent != n) // not the dummy root
      descendants(parent) += descendants(j) + 1;
  }
  // Identify the relaxed supernodes by postorder traversal of the etree
  Index snode_start; // beginning of a snode 
  for (j = 0; j < n; )
  {
    parent = et(j);
    snode_start = j; 
    while ( parent != n && descendants(parent) < relax_columns ) 
    {
      j = parent; 
      parent = et(j);
    }
    // Found a supernode in postordered etree, j is the last column 
    relax_end(snode_start) = j; // Record last column
    j++;
    // Search for a new leaf
    while (descendants(j) != 0 && j < n) j++;
  } // End postorder traversal of the etree
  
}